

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O1

int Curl_parsenetrc(char *host,char **loginp,char **passwordp,char *netrcfile)

{
  bool bVar1;
  bool bVar2;
  __uid_t __uid;
  int iVar3;
  char *pcVar4;
  passwd *ppVar5;
  FILE *__stream;
  char *pcVar6;
  int iVar7;
  char cVar8;
  bool bVar9;
  bool bVar10;
  char *tok_buf;
  char netrcbuffer [256];
  int local_168;
  char *local_140;
  char local_138 [264];
  
  if (*loginp == (char *)0x0) {
    bVar9 = false;
  }
  else {
    bVar9 = **loginp != '\0';
  }
  if (netrcfile == (char *)0x0) {
    pcVar4 = curl_getenv("HOME");
    pcVar6 = pcVar4;
    if (pcVar4 == (char *)0x0) {
      __uid = geteuid();
      ppVar5 = getpwuid(__uid);
      if (ppVar5 == (passwd *)0x0) {
        pcVar6 = (char *)0x0;
      }
      else {
        pcVar6 = ppVar5->pw_dir;
      }
    }
    if (pcVar6 == (char *)0x0) {
      iVar7 = 1;
      netrcfile = (char *)0x0;
      bVar10 = false;
    }
    else {
      netrcfile = curl_maprintf("%s%s%s",pcVar6,"/",".netrc");
      if (pcVar4 != (char *)0x0) {
        (*Curl_cfree)(pcVar6);
      }
      bVar10 = netrcfile != (char *)0x0;
      iVar7 = -1;
    }
    if (!bVar10) {
      return iVar7;
    }
  }
  else {
    bVar10 = false;
  }
  __stream = fopen64(netrcfile,"r");
  if (bVar10) {
    (*Curl_cfree)(netrcfile);
  }
  if (__stream == (FILE *)0x0) {
    iVar7 = 1;
  }
  else {
    iVar7 = 1;
    bVar2 = false;
    local_168 = 0;
    bVar1 = false;
    bVar10 = false;
    cVar8 = '\0';
    while( true ) {
      pcVar6 = fgets(local_138,0x100,__stream);
      if (pcVar6 == (char *)0x0) break;
      pcVar6 = strtok_r(local_138," \t\n",&local_140);
      while (pcVar6 != (char *)0x0) {
        pcVar4 = *loginp;
        if ((((pcVar4 != (char *)0x0) && (*pcVar4 != '\0')) && (*passwordp != (char *)0x0)) &&
           (**passwordp != '\0')) {
          bVar2 = true;
          break;
        }
        if (cVar8 == '\x02') {
          if (bVar10) {
            if (bVar9) {
              local_168 = Curl_raw_equal(pcVar4,pcVar6);
            }
            else {
              (*Curl_cfree)(pcVar4);
              pcVar6 = (*Curl_cstrdup)(pcVar6);
              *loginp = pcVar6;
              if (pcVar6 == (char *)0x0) {
LAB_0057a982:
                iVar7 = -1;
                goto LAB_0057a987;
              }
            }
            cVar8 = '\x02';
            bVar10 = false;
          }
          else {
            if (bVar1) {
              cVar8 = '\x02';
              if (!(bool)(bVar9 & local_168 == 0)) {
                (*Curl_cfree)(*passwordp);
                pcVar6 = (*Curl_cstrdup)(pcVar6);
                *passwordp = pcVar6;
                if (pcVar6 == (char *)0x0) goto LAB_0057a982;
              }
              bVar10 = false;
            }
            else {
              iVar3 = Curl_raw_equal("login",pcVar6);
              cVar8 = '\x02';
              if (iVar3 == 0) {
                iVar3 = Curl_raw_equal("password",pcVar6);
                bVar10 = false;
                if (iVar3 != 0) {
                  bVar1 = true;
                  goto LAB_0057a943;
                }
                iVar3 = Curl_raw_equal("machine",pcVar6);
                if (iVar3 != 0) {
                  local_168 = 0;
                }
                cVar8 = (iVar3 == 0) + '\x01';
              }
              else {
                bVar10 = true;
              }
            }
            bVar1 = false;
          }
        }
        else {
          pcVar4 = host;
          if (cVar8 != '\x01') {
            iVar3 = Curl_raw_equal("machine",pcVar6);
            cVar8 = '\x01';
            if (iVar3 != 0) goto LAB_0057a943;
            pcVar4 = "default";
          }
          iVar3 = Curl_raw_equal(pcVar4,pcVar6);
          if (iVar3 != 0) {
            iVar7 = 0;
          }
          cVar8 = (iVar3 != 0) * '\x02';
        }
LAB_0057a943:
        pcVar6 = strtok_r((char *)0x0," \t\n",&local_140);
      }
      if (bVar2) break;
    }
LAB_0057a987:
    fclose(__stream);
  }
  return iVar7;
}

Assistant:

int Curl_parsenetrc(const char *host,
                    char **loginp,
                    char **passwordp,
                    char *netrcfile)
{
  FILE *file;
  int retcode=1;
  int specific_login = (*loginp && **loginp != 0);
  bool netrc_alloc = FALSE;
  enum host_lookup_state state=NOTHING;

  char state_login=0;      /* Found a login keyword */
  char state_password=0;   /* Found a password keyword */
  int state_our_login=FALSE;  /* With specific_login, found *our* login name */

#define NETRC DOT_CHAR "netrc"

  if(!netrcfile) {
    bool home_alloc = FALSE;
    char *home = curl_getenv("HOME"); /* portable environment reader */
    if(home) {
      home_alloc = TRUE;
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd pw, *pw_res;
      char pwbuf[1024];
      if(!getpwuid_r(geteuid(), &pw, pwbuf, sizeof(pwbuf), &pw_res)
         && pw_res) {
        home = strdup(pw.pw_dir);
        if(!home)
          return CURLE_OUT_OF_MEMORY;
        home_alloc = TRUE;
      }
#elif defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw= getpwuid(geteuid());
      if(pw) {
        home = pw->pw_dir;
      }
#endif
    }

    if(!home)
      return retcode; /* no home directory found (or possibly out of memory) */

    netrcfile = curl_maprintf("%s%s%s", home, DIR_CHAR, NETRC);
    if(home_alloc)
      free(home);
    if(!netrcfile) {
      return -1;
    }
    netrc_alloc = TRUE;
  }

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(netrc_alloc)
    free(netrcfile);
  if(file) {
    char *tok;
    char *tok_buf;
    bool done=FALSE;
    char netrcbuffer[256];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && fgets(netrcbuffer, netrcbuffsize, file)) {
      tok=strtok_r(netrcbuffer, " \t\n", &tok_buf);
      while(!done && tok) {

        if((*loginp && **loginp) && (*passwordp && **passwordp)) {
          done=TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(Curl_raw_equal("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state=HOSTFOUND;
          }
          else if(Curl_raw_equal("default", tok)) {
            state=HOSTVALID;
            retcode=0; /* we did find our host */
          }
          break;
        case HOSTFOUND:
          if(Curl_raw_equal(host, tok)) {
            /* and yes, this is our host! */
            state=HOSTVALID;
            retcode=0; /* we did find our host */
          }
          else
            /* not our host */
            state=NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = Curl_raw_equal(*loginp, tok);
            }
            else {
              free(*loginp);
              *loginp = strdup(tok);
              if(!*loginp) {
                retcode = -1; /* allocation failed */
                goto out;
              }
            }
            state_login=0;
          }
          else if(state_password) {
            if(state_our_login || !specific_login) {
              free(*passwordp);
              *passwordp = strdup(tok);
              if(!*passwordp) {
                retcode = -1; /* allocation failed */
                goto out;
              }
            }
            state_password=0;
          }
          else if(Curl_raw_equal("login", tok))
            state_login=1;
          else if(Curl_raw_equal("password", tok))
            state_password=1;
          else if(Curl_raw_equal("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */

        tok = strtok_r(NULL, " \t\n", &tok_buf);
      } /* while(tok) */
    } /* while fgets() */

    out:
    fclose(file);
  }

  return retcode;
}